

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-map.c
# Opt level: O3

void move_cursor_relative(wchar_t y,wchar_t x)

{
  term *t;
  ulong uVar1;
  term *t_00;
  int iVar2;
  int iVar3;
  wchar_t j;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  wchar_t y_00;
  uint uVar9;
  wchar_t x_00;
  int iVar10;
  
  lVar4 = 0;
  do {
    t_00 = Term;
    t = angband_term[lVar4];
    if ((t != (term *)0x0) && ((window_flag[lVar4] & 0xa0) != 0)) {
      uVar9 = (uint)tile_height;
      if ((window_flag[lVar4] & 0x20) == 0) {
        y_00 = (uVar9 + (tile_height == '\0') & 0xff) * (y - t->offset_y);
        x_00 = x - t->offset_x;
        if (1 < tile_width) {
          x_00 = x_00 * (uint)tile_width;
        }
      }
      else {
        iVar3 = cave->height;
        iVar10 = cave->width;
        iVar6 = t->hgt + -2;
        iVar2 = iVar3;
        if (1 < tile_height) {
          iVar2 = uVar9 - iVar3 % (int)uVar9;
          if (iVar3 % (int)uVar9 < 1) {
            iVar2 = 0;
          }
          iVar6 = iVar6 - iVar6 % (int)uVar9;
          iVar2 = iVar2 + iVar3;
        }
        iVar5 = t->wid + -2;
        uVar8 = (uint)tile_width;
        iVar7 = iVar10;
        if (1 < tile_width) {
          iVar7 = uVar8 - iVar10 % (int)uVar8;
          if (iVar10 % (int)uVar8 < 1) {
            iVar7 = 0;
          }
          iVar5 = iVar5 - iVar5 % (int)uVar8;
          iVar7 = iVar7 + iVar10;
        }
        if (iVar6 < iVar2) {
          iVar2 = iVar6;
        }
        if (iVar5 < iVar7) {
          iVar7 = iVar5;
        }
        uVar1 = (long)(iVar2 * y) / (long)iVar3;
        iVar3 = (int)uVar1;
        if (1 < tile_height) {
          iVar3 = iVar3 - (int)((long)((ulong)(uint)(iVar3 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) %
                               (long)(int)uVar9);
        }
        uVar1 = (long)(iVar7 * x) / (long)iVar10;
        iVar10 = (int)uVar1;
        if (1 < tile_width) {
          iVar10 = iVar10 - (int)((long)((ulong)(uint)(iVar10 >> 0x1f) << 0x20 | uVar1 & 0xffffffff)
                                 % (long)(int)uVar8);
        }
        y_00 = iVar3 + L'\x01';
        x_00 = iVar10 + L'\x01';
      }
      if ((((L'\xffffffff' < y_00) && (y_00 < t->hgt)) && (L'\xffffffff' < x_00)) && (x_00 < t->wid)
         ) {
        Term_activate(t);
        Term_gotoxy(x_00,y_00);
        Term_activate(t_00);
      }
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 8);
  iVar3 = y - Term->offset_y;
  if (-1 < iVar3) {
    iVar10 = Term->sidebar_mode;
    if ((iVar3 < (Term->hgt - (row_bottom_map[iVar10] + row_top_map[iVar10])) /
                 (int)(uint)tile_height) && (iVar2 = x - Term->offset_x, -1 < iVar2)) {
      if (iVar2 < (~col_map[iVar10] + Term->wid) / (int)(uint)tile_width) {
        iVar6 = (tile_width - 1) * iVar2;
        if (tile_width < 2) {
          iVar6 = 0;
        }
        iVar7 = (tile_height - 1) * iVar3;
        if (tile_height < 2) {
          iVar7 = 0;
        }
        Term_gotoxy(iVar6 + col_map[iVar10] + iVar2,iVar7 + row_top_map[iVar10] + iVar3);
        return;
      }
    }
  }
  return;
}

Assistant:

void move_cursor_relative(int y, int x)
{
	int ky, kx;
	int vy, vx;

	/* Move the cursor on map sub-windows */
	move_cursor_relative_map(y, x);

	/* Location relative to panel */
	ky = y - Term->offset_y;

	/* Verify location */
	if ((ky < 0) || (ky >= SCREEN_HGT)) return;

	/* Location relative to panel */
	kx = x - Term->offset_x;

	/* Verify location */
	if ((kx < 0) || (kx >= SCREEN_WID)) return;

	/* Location in window */
	vy = ky + ROW_MAP;

	/* Location in window */
	vx = kx + COL_MAP;

	if (tile_width > 1)
		vx += (tile_width - 1) * kx;

	if (tile_height > 1)
		vy += (tile_height - 1) * ky;

	/* Go there */
	(void)Term_gotoxy(vx, vy);
}